

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O3

U32 ZSTD_insertBt1(ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,U32 mls,int extDict)

{
  ulong *ip_00;
  BYTE *pBVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *puVar10;
  uint *puVar11;
  char cVar12;
  long lVar13;
  ulong *puVar14;
  uint *puVar15;
  ulong uVar16;
  uint uVar17;
  uint *puVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  BYTE *pInLoopLimit;
  ulong *puVar22;
  BYTE *pBVar23;
  ulong uVar24;
  bool bVar25;
  U32 dummy32;
  int local_e4;
  uint local_b4;
  BYTE *local_b0;
  BYTE *local_a8;
  BYTE *local_a0;
  U32 *local_98;
  BYTE *local_90;
  ulong *local_88;
  ulong local_80;
  ulong local_78;
  BYTE *local_70;
  ulong *local_68;
  ulong *local_60;
  ulong local_58;
  ulong *local_50;
  BYTE *local_48;
  BYTE *local_40;
  ulong local_38;
  
  cVar12 = (char)(ms->cParams).hashLog;
  switch(mls) {
  case 5:
    lVar13 = -0x30e4432345000000;
    break;
  case 6:
    lVar13 = -0x30e4432340650000;
    break;
  case 7:
    lVar13 = -0x30e44323405a9d00;
    break;
  case 8:
    lVar13 = -0x30e44323485a9b9d;
    break;
  default:
    uVar5 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-cVar12 & 0x1fU));
    goto LAB_0069606f;
  }
  uVar5 = (ulong)(lVar13 * *(long *)ip) >> (-cVar12 & 0x3fU);
LAB_0069606f:
  local_98 = ms->chainTable;
  uVar21 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  uVar20 = ms->hashTable[uVar5];
  local_a0 = (ms->window).base;
  local_a8 = (ms->window).dictBase;
  uVar19 = (ulong)(ms->window).dictLimit;
  local_78._0_4_ = (int)ip - (int)local_a0;
  uVar4 = (uint)local_78 - uVar21;
  if ((uint)local_78 < uVar21) {
    uVar4 = 0;
  }
  uVar24 = (ulong)(((uint)local_78 & uVar21) * 2);
  uVar2 = (ms->window).lowLimit;
  uVar17 = (ms->cParams).searchLog;
  ms->hashTable[uVar5] = (uint)local_78;
  puVar18 = local_98 + uVar24;
  local_e4 = (uint)local_78 + 9;
  if (uVar20 < uVar2) {
    puVar18[0] = 0;
    puVar18[1] = 0;
    uVar20 = 0;
LAB_00696405:
    uVar4 = (local_e4 - (uint)local_78) - 8;
    if (uVar4 < uVar20) {
      uVar4 = uVar20;
    }
    return uVar4;
  }
  local_40 = local_a8 + uVar19;
  local_48 = local_a0 + uVar19;
  puVar15 = local_98 + uVar24 + 1;
  uVar17 = ~(-1 << ((byte)uVar17 & 0x1f));
  puVar22 = (ulong *)(iend + -7);
  local_60 = (ulong *)(iend + -3);
  local_68 = (ulong *)(iend + -1);
  local_b0 = local_a0 + 8;
  local_70 = ip + 8;
  uVar24 = 8;
  local_80 = 0;
  uVar5 = 0;
  local_90 = ip;
  local_88 = (ulong *)iend;
  local_78 = (ulong)(uint)local_78;
  local_58 = uVar19;
  local_50 = puVar22;
LAB_0069618c:
  uVar16 = (ulong)uVar20;
  uVar7 = local_80;
  if (uVar5 < local_80) {
    uVar7 = uVar5;
  }
  uVar9 = uVar16 + uVar7;
  ip_00 = (ulong *)(local_90 + uVar7);
  if ((extDict == 0) || (uVar19 <= uVar9)) {
    puVar14 = (ulong *)(local_a0 + uVar16 + uVar7);
    puVar10 = ip_00;
    if (ip_00 < puVar22) {
      if (*puVar14 == *ip_00) {
        lVar13 = 0;
        do {
          puVar10 = (ulong *)(local_70 + lVar13 + uVar7);
          if (puVar22 <= puVar10) {
            puVar14 = (ulong *)(local_b0 + uVar9 + lVar13);
            goto LAB_006962b6;
          }
          lVar3 = lVar13 + uVar9;
          lVar13 = lVar13 + 8;
        } while (*(ulong *)(local_b0 + lVar3) == *puVar10);
        uVar8 = *puVar10 ^ *(ulong *)(local_b0 + lVar3);
        uVar9 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
          }
        }
        uVar9 = (uVar9 >> 3 & 0x1fffffff) + lVar13;
      }
      else {
        uVar8 = *ip_00 ^ *puVar14;
        uVar9 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
          }
        }
        uVar9 = uVar9 >> 3 & 0x1fffffff;
      }
    }
    else {
LAB_006962b6:
      if ((puVar10 < local_60) && ((int)*puVar14 == (int)*puVar10)) {
        puVar10 = (ulong *)((long)puVar10 + 4);
        puVar14 = (ulong *)((long)puVar14 + 4);
      }
      if ((puVar10 < local_68) && ((short)*puVar14 == (short)*puVar10)) {
        puVar10 = (ulong *)((long)puVar10 + 2);
        puVar14 = (ulong *)((long)puVar14 + 2);
      }
      if (puVar10 < local_88) {
        puVar10 = (ulong *)((long)puVar10 + (ulong)((byte)*puVar14 == (byte)*puVar10));
      }
      uVar9 = (long)puVar10 - (long)ip_00;
    }
    uVar7 = uVar9 + uVar7;
    pBVar23 = local_a0 + uVar16;
  }
  else {
    pBVar1 = local_a8 + uVar16;
    local_38 = uVar16;
    sVar6 = ZSTD_count_2segments((BYTE *)ip_00,pBVar1 + uVar7,(BYTE *)local_88,local_40,local_48);
    uVar20 = (uint)local_38;
    uVar7 = sVar6 + uVar7;
    puVar22 = local_50;
    pBVar23 = local_a0 + uVar16;
    uVar19 = local_58;
    if (uVar7 + uVar16 < local_58) {
      pBVar23 = pBVar1;
    }
  }
  if ((uVar24 < uVar7) && (uVar24 = uVar7, local_e4 - uVar20 < uVar7)) {
    local_e4 = uVar20 + (int)uVar7;
  }
  if ((ulong *)(local_90 + uVar7) == local_88) goto LAB_006963db;
  puVar11 = local_98 + (uVar20 & uVar21) * 2;
  if (pBVar23[uVar7] < (byte)*(ulong *)(local_90 + uVar7)) {
    *puVar18 = uVar20;
    if (uVar20 <= uVar4) {
      puVar18 = &local_b4;
LAB_006963db:
      *puVar15 = 0;
      uVar4 = (int)uVar24 - 0x180;
      uVar20 = 0xc0;
      if (uVar4 < 0xc0) {
        uVar20 = uVar4;
      }
      *puVar18 = 0;
      if (uVar24 < 0x181) {
        uVar20 = 0;
      }
      goto LAB_00696405;
    }
    puVar11 = puVar11 + 1;
    puVar18 = puVar11;
    uVar5 = uVar7;
  }
  else {
    *puVar15 = uVar20;
    puVar15 = puVar11;
    local_80 = uVar7;
    if (uVar20 <= uVar4) {
      puVar15 = &local_b4;
      goto LAB_006963db;
    }
  }
  bVar25 = uVar17 == 0;
  uVar17 = uVar17 - 1;
  if ((bVar25) || (uVar20 = *puVar11, uVar20 < uVar2)) goto LAB_006963db;
  goto LAB_0069618c;
}

Assistant:

static U32 ZSTD_insertBt1(
                ZSTD_matchState_t* ms,
                const BYTE* const ip, const BYTE* const iend,
                U32 const mls, const int extDict)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32 matchIndex = hashTable[h];
    size_t commonLengthSmaller=0, commonLengthLarger=0;
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const U32 dictLimit = ms->window.dictLimit;
    const BYTE* const dictEnd = dictBase + dictLimit;
    const BYTE* const prefixStart = base + dictLimit;
    const BYTE* match;
    const U32 curr = (U32)(ip-base);
    const U32 btLow = btMask >= curr ? 0 : curr - btMask;
    U32* smallerPtr = bt + 2*(curr&btMask);
    U32* largerPtr  = smallerPtr + 1;
    U32 dummy32;   /* to be nullified at the end */
    U32 const windowLow = ms->window.lowLimit;
    U32 matchEndIdx = curr+8+1;
    size_t bestLength = 8;
    U32 nbCompares = 1U << cParams->searchLog;
#ifdef ZSTD_C_PREDICT
    U32 predictedSmall = *(bt + 2*((curr-1)&btMask) + 0);
    U32 predictedLarge = *(bt + 2*((curr-1)&btMask) + 1);
    predictedSmall += (predictedSmall>0);
    predictedLarge += (predictedLarge>0);
#endif /* ZSTD_C_PREDICT */

    DEBUGLOG(8, "ZSTD_insertBt1 (%u)", curr);

    assert(ip <= iend-8);   /* required for h calculation */
    hashTable[h] = curr;   /* Update Hash Table */

    assert(windowLow > 0);
    while (nbCompares-- && (matchIndex >= windowLow)) {
        U32* const nextPtr = bt + 2*(matchIndex & btMask);
        size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
        assert(matchIndex < curr);

#ifdef ZSTD_C_PREDICT   /* note : can create issues when hlog small <= 11 */
        const U32* predictPtr = bt + 2*((matchIndex-1) & btMask);   /* written this way, as bt is a roll buffer */
        if (matchIndex == predictedSmall) {
            /* no need to check length, result known */
            *smallerPtr = matchIndex;
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
            matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            predictedSmall = predictPtr[1] + (predictPtr[1]>0);
            continue;
        }
        if (matchIndex == predictedLarge) {
            *largerPtr = matchIndex;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
            predictedLarge = predictPtr[0] + (predictPtr[0]>0);
            continue;
        }
#endif

        if (!extDict || (matchIndex+matchLength >= dictLimit)) {
            assert(matchIndex+matchLength >= dictLimit);   /* might be wrong if actually extDict */
            match = base + matchIndex;
            matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
        } else {
            match = dictBase + matchIndex;
            matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
            if (matchIndex+matchLength >= dictLimit)
                match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
        }

        if (matchLength > bestLength) {
            bestLength = matchLength;
            if (matchLength > matchEndIdx - matchIndex)
                matchEndIdx = matchIndex + (U32)matchLength;
        }

        if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
            break;   /* drop , to guarantee consistency ; miss a bit of compression, but other solutions can corrupt tree */
        }

        if (match[matchLength] < ip[matchLength]) {  /* necessarily within buffer */
            /* match is smaller than current */
            *smallerPtr = matchIndex;             /* update smaller idx */
            commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            smallerPtr = nextPtr+1;               /* new "candidate" => larger than match, which was smaller than target */
            matchIndex = nextPtr[1];              /* new matchIndex, larger than previous and closer to current */
        } else {
            /* match is larger than current */
            *largerPtr = matchIndex;
            commonLengthLarger = matchLength;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
    }   }

    *smallerPtr = *largerPtr = 0;
    {   U32 positions = 0;
        if (bestLength > 384) positions = MIN(192, (U32)(bestLength - 384));   /* speed optimization */
        assert(matchEndIdx > curr + 8);
        return MAX(positions, matchEndIdx - (curr + 8));
    }
}